

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

void __thiscall PlayerA::SetSampleRate(PlayerA *this,UINT32 sampleRate)

{
  PlayerBase *pPVar1;
  uint uVar2;
  pointer ppPVar3;
  ulong uVar4;
  
  this->_smplRate = sampleRate;
  ppPVar3 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar3) {
    uVar4 = 0;
    do {
      if ((ppPVar3[uVar4] != this->_player) ||
         (uVar2 = (*this->_player->_vptr_PlayerBase[0x19])(), (uVar2 & 1) == 0)) {
        pPVar1 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
        (*pPVar1->_vptr_PlayerBase[0xf])(pPVar1,(ulong)this->_smplRate);
      }
      uVar4 = uVar4 + 1;
      ppPVar3 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->_avbPlrs).
                                   super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3));
  }
  return;
}

Assistant:

void PlayerA::SetSampleRate(UINT32 sampleRate)
{
	_smplRate = sampleRate;
	for (size_t curPlr = 0; curPlr < _avbPlrs.size(); curPlr++)
	{
		if (_avbPlrs[curPlr] == _player && (_player->GetState() & PLAYSTATE_PLAY))
			continue;
		_avbPlrs[curPlr]->SetSampleRate(_smplRate);
	}
	return;
}